

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_CRUNCH(effect_handler_context_t_conflict *context)

{
  uint32_t uVar1;
  char *fmt;
  
  uVar1 = Rand_div(2);
  fmt = "It nearly breaks your tooth!";
  if (uVar1 == 0) {
    fmt = "It\'s crunchy.";
  }
  msg(fmt);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_CRUNCH(effect_handler_context_t *context)
{
	if (one_in_(2))
		msg("It's crunchy.");
	else
		msg("It nearly breaks your tooth!");
	context->ident = true;
	return true;
}